

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O3

int SubsetCountNodesAux(DdNode *node,st__table *table,double max)

{
  int *piVar1;
  double **ppdVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  DdNode *node_00;
  ulong uVar8;
  DdNode *node_01;
  long lVar9;
  long lVar10;
  NodeData_t **__ptr;
  double dVar11;
  double dVar12;
  NodeData_t *dummyNBar;
  NodeData_t *dummyN;
  NodeData_t *dummyNnv;
  NodeData_t *dummyNv;
  char *local_58;
  char *local_50;
  double local_48;
  char *local_40;
  char *local_38;
  
  if (node == (DdNode *)0x0) {
    return 0;
  }
  piVar6 = (int *)((ulong)node & 0xfffffffffffffffe);
  if (*piVar6 == 0x7fffffff) {
    return 0;
  }
  iVar3 = st__lookup(table,(char *)node,&local_50);
  if (iVar3 != 1) {
    return 0;
  }
  if (*(long *)(local_50 + 8) != 0) {
    return 0;
  }
  uVar8 = *(ulong *)(piVar6 + 6);
  uVar7 = (ulong)((uint)node & 1);
  node_01 = (DdNode *)(uVar7 ^ *(ulong *)(piVar6 + 4));
  if (*(int *)(*(ulong *)(piVar6 + 4) & 0xfffffffffffffffe) == 0x7fffffff) {
    dVar12 = 0.0;
    if (zero != node_01) {
      dVar12 = max;
    }
  }
  else {
    iVar3 = st__lookup(table,(char *)node_01,&local_38);
    if (iVar3 != 1) {
      return 0;
    }
    dVar12 = **(double **)local_38;
  }
  node_00 = (DdNode *)(uVar7 ^ uVar8);
  if (*(int *)(uVar8 & 0xfffffffffffffffe) == 0x7fffffff) {
    dVar11 = 0.0;
    if (zero != node_00) {
      dVar11 = max;
    }
  }
  else {
    local_48 = dVar12;
    iVar3 = st__lookup(table,(char *)node_00,&local_40);
    if (iVar3 != 1) {
      return 0;
    }
    dVar11 = **(double **)local_40;
    dVar12 = local_48;
  }
  if (dVar11 <= dVar12) {
    iVar3 = SubsetCountNodesAux(node_01,table,max);
    if (memOut != '\0') {
      return 0;
    }
    iVar5 = SubsetCountNodesAux(node_00,table,max);
    if (memOut != '\0') {
      return 0;
    }
    iVar4 = iVar5;
    if ((pageIndex != 0x800) || (ResizeCountNodePages(), ppdVar2 = mintermPages, memOut == '\0'))
    goto LAB_007988f1;
    uVar8 = (ulong)(uint)page;
    if (page < 0) {
      if (mintermPages != (double **)0x0) goto LAB_00798af6;
    }
    else {
      lVar9 = 0;
      do {
        if (ppdVar2[lVar9] != (double *)0x0) {
          free(ppdVar2[lVar9]);
          ppdVar2[lVar9] = (double *)0x0;
        }
        lVar9 = lVar9 + 1;
      } while (uVar8 + 1 != lVar9);
LAB_00798af6:
      free(ppdVar2);
      mintermPages = (double **)0x0;
    }
    __ptr = nodeDataPages;
    uVar8 = (ulong)(uint)nodeDataPage;
    if (-1 < nodeDataPage) {
      lVar9 = 0;
      do {
        if (__ptr[lVar9] != (NodeData_t *)0x0) {
          free(__ptr[lVar9]);
          __ptr[lVar9] = (NodeData_t *)0x0;
        }
        lVar9 = lVar9 + 1;
      } while (uVar8 + 1 != lVar9);
      goto LAB_00798b95;
    }
LAB_00798b90:
    __ptr = nodeDataPages;
    if (nodeDataPages == (NodeData_t **)0x0) goto LAB_00798ba8;
  }
  else {
    iVar4 = SubsetCountNodesAux(node_00,table,max);
    if (memOut != '\0') {
      return 0;
    }
    iVar5 = SubsetCountNodesAux(node_01,table,max);
    if (memOut != '\0') {
      return 0;
    }
    iVar3 = iVar5;
    if ((pageIndex == 0x800) && (ResizeCountNodePages(), ppdVar2 = mintermPages, memOut != '\0')) {
      uVar8 = (ulong)(uint)page;
      if (page < 0) {
        if (mintermPages != (double **)0x0) goto LAB_00798a9e;
      }
      else {
        lVar9 = 0;
        do {
          if (ppdVar2[lVar9] != (double *)0x0) {
            free(ppdVar2[lVar9]);
            ppdVar2[lVar9] = (double *)0x0;
          }
          lVar9 = lVar9 + 1;
        } while (uVar8 + 1 != lVar9);
LAB_00798a9e:
        free(ppdVar2);
        mintermPages = (double **)0x0;
      }
      __ptr = nodeDataPages;
      uVar8 = (ulong)(uint)nodeDataPage;
      if (nodeDataPage < 0) goto LAB_00798b90;
      lVar9 = 0;
      do {
        if (__ptr[lVar9] != (NodeData_t *)0x0) {
          free(__ptr[lVar9]);
          __ptr[lVar9] = (NodeData_t *)0x0;
        }
        lVar9 = lVar9 + 1;
      } while (uVar8 + 1 != lVar9);
    }
    else {
LAB_007988f1:
      piVar6 = currentLightNodePage + pageIndex;
      *piVar6 = iVar5;
      *(int **)(local_50 + 0x10) = piVar6;
      piVar6 = currentNodePage + pageIndex;
      *piVar6 = iVar4 + iVar3 + 1;
      *(int **)(local_50 + 8) = piVar6;
      pageIndex = pageIndex + 1;
      iVar3 = st__lookup(table,(char *)((ulong)node ^ 1),&local_58);
      if (iVar3 != 1) {
LAB_00798a3c:
        return *piVar6;
      }
      if (pageIndex == 0x800) {
        ResizeCountNodePages();
      }
      ppdVar2 = mintermPages;
      if (memOut == '\x01') {
        lVar9 = (long)page;
        if (lVar9 < 1) {
          if (mintermPages != (double **)0x0) goto LAB_00798a49;
        }
        else {
          lVar10 = 0;
          do {
            if (ppdVar2[lVar10] != (double *)0x0) {
              free(ppdVar2[lVar10]);
              ppdVar2[lVar10] = (double *)0x0;
            }
            lVar10 = lVar10 + 1;
          } while (lVar9 != lVar10);
LAB_00798a49:
          free(ppdVar2);
          mintermPages = (double **)0x0;
        }
        __ptr = nodeDataPages;
        lVar9 = (long)nodeDataPage;
        if (0 < lVar9) {
          lVar10 = 0;
          do {
            if (__ptr[lVar10] != (NodeData_t *)0x0) {
              free(__ptr[lVar10]);
              __ptr[lVar10] = (NodeData_t *)0x0;
            }
            lVar10 = lVar10 + 1;
          } while (lVar9 != lVar10);
          goto LAB_00798b95;
        }
        goto LAB_00798b90;
      }
      lVar9 = (long)pageIndex;
      piVar1 = currentLightNodePage + lVar9;
      *piVar1 = 0;
      *(int **)(local_58 + 0x10) = piVar1;
      if ((lVar9 != 0x800) || (ResizeCountNodePages(), ppdVar2 = mintermPages, memOut != '\x01')) {
        piVar1 = currentNodePage + pageIndex;
        *piVar1 = 0;
        *(int **)(local_58 + 8) = piVar1;
        pageIndex = pageIndex + 1;
        goto LAB_00798a3c;
      }
      lVar9 = (long)page;
      if (lVar9 < 1) {
        if (mintermPages != (double **)0x0) goto LAB_00798b47;
      }
      else {
        lVar10 = 0;
        do {
          if (ppdVar2[lVar10] != (double *)0x0) {
            free(ppdVar2[lVar10]);
            ppdVar2[lVar10] = (double *)0x0;
          }
          lVar10 = lVar10 + 1;
        } while (lVar9 != lVar10);
LAB_00798b47:
        free(ppdVar2);
        mintermPages = (double **)0x0;
      }
      __ptr = nodeDataPages;
      lVar9 = (long)nodeDataPage;
      if (lVar9 < 1) goto LAB_00798b90;
      lVar10 = 0;
      do {
        if (__ptr[lVar10] != (NodeData_t *)0x0) {
          free(__ptr[lVar10]);
          __ptr[lVar10] = (NodeData_t *)0x0;
        }
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
    }
  }
LAB_00798b95:
  free(__ptr);
  nodeDataPages = (NodeData_t **)0x0;
LAB_00798ba8:
  st__free_table(table);
  return 0;
}

Assistant:

static int
SubsetCountNodesAux(
  DdNode * node /* current node */,
  st__table * table /* table to update node count, also serves as visited table. */,
  double  max /* maximum number of variables */)
{
    int tval, eval, i;
    DdNode *N, *Nv, *Nnv;
    double minNv, minNnv;
    NodeData_t *dummyN, *dummyNv, *dummyNnv, *dummyNBar;
    int *pmin, *pminBar, *val;

    if ((node == NULL) || Cudd_IsConstant(node))
        return(0);

    /* if this node has been processed do nothing */
    if ( st__lookup(table, (const char *)node, (char **)&dummyN) == 1) {
        val = dummyN->nodesPointer;
        if (val != NULL)
            return(0);
    } else {
        return(0);
    }

    N  = Cudd_Regular(node);
    Nv = Cudd_T(N);
    Nnv = Cudd_E(N);

    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* find the minterm counts for the THEN and ELSE branches */
    if (Cudd_IsConstant(Nv)) {
        if (Nv == zero) {
            minNv = 0.0;
        } else {
            minNv = max;
        }
    } else {
        if ( st__lookup(table, (const char *)Nv, (char **)&dummyNv) == 1)
            minNv = *(dummyNv->mintermPointer);
        else {
            return(0);
        }
    }
    if (Cudd_IsConstant(Nnv)) {
        if (Nnv == zero) {
            minNnv = 0.0;
        } else {
            minNnv = max;
        }
    } else {
        if ( st__lookup(table, (const char *)Nnv, (char **)&dummyNnv) == 1) {
            minNnv = *(dummyNnv->mintermPointer);
        }
        else {
            return(0);
        }
    }


    /* recur based on which has larger minterm, */
    if (minNv >= minNnv) {
        tval = SubsetCountNodesAux(Nv, table, max);
        if (memOut) return(0);
        eval = SubsetCountNodesAux(Nnv, table, max);
        if (memOut) return(0);

        /* store the node count of the lighter child. */
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pmin = currentLightNodePage + pageIndex;
        *pmin = eval; /* Here the ELSE child is lighter */
        dummyN->lightChildNodesPointer = pmin;

    } else {
        eval = SubsetCountNodesAux(Nnv, table, max);
        if (memOut) return(0);
        tval = SubsetCountNodesAux(Nv, table, max);
        if (memOut) return(0);

        /* store the node count of the lighter child. */
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pmin = currentLightNodePage + pageIndex;
        *pmin = tval; /* Here the THEN child is lighter */
        dummyN->lightChildNodesPointer = pmin;

    }
    /* updating the page index for node count storage. */
    pmin = currentNodePage + pageIndex;
    *pmin = tval + eval + 1;
    dummyN->nodesPointer = pmin;

    /* pageIndex is parallel page index for count_nodes and count_lightNodes */
    pageIndex++;

    /* if this node has been reached first, it belongs to a heavier
       branch. Its complement will be reached later on a lighter branch.
       Hence the complement has zero node count. */

    if ( st__lookup(table, (const char *)Cudd_Not(node), (char **)&dummyNBar) == 1)  {
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i < page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i < nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pminBar = currentLightNodePage + pageIndex;
        *pminBar = 0;
        dummyNBar->lightChildNodesPointer = pminBar;
        /* The lighter child has less nodes than the parent.
         * So if parent 0 then lighter child zero
         */
        if (pageIndex == pageSize) ResizeCountNodePages();
        if (memOut) {
            for (i = 0; i < page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i < nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0);
        }
        pminBar = currentNodePage + pageIndex;
        *pminBar = 0;
        dummyNBar->nodesPointer = pminBar ; /* maybe should point to zero */

        pageIndex++;
    }
    return(*pmin);
}